

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diplodocus.cpp
# Opt level: O2

void getStats(void)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  undefined1 local_650 [8];
  ofstream contextTriplesstats;
  undefined1 local_450 [8];
  ofstream ProvIdxstats;
  undefined1 local_250 [8];
  ofstream Moleculesstats;
  undefined1 local_50 [8];
  pair<const_unsigned_long,_Molecule> i_1;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"writing stats");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_450,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"contextTriples.stats");
  std::ofstream::ofstream(local_650,(string *)local_450,_S_out);
  std::__cxx11::string::~string((string *)local_450);
  plVar3 = (long *)(diplo::contextTriples + 0x10);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    iVar1 = *(int *)(plVar3 + 2);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_650);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"ProvIdx.stats");
  std::ofstream::ofstream(local_450,(string *)local_250,_S_out);
  std::__cxx11::string::~string((string *)local_250);
  plVar3 = (long *)(diplo::ProvIdx + 0x10);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    std::
    pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::pair((pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
            *)local_250,
           (pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>
            *)(plVar3 + 1));
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_450);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::
    _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&Moleculesstats);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 diplo::statsDir_abi_cxx11_,"Molecules.stats");
  std::ofstream::ofstream(local_250,(string *)local_50,_S_out);
  std::__cxx11::string::~string((string *)local_50);
  plVar3 = (long *)(diplo::M + 0x40);
  while (plVar3 = (long *)*plVar3, plVar3 != (long *)0x0) {
    std::pair<const_unsigned_long,_Molecule>::pair
              ((pair<const_unsigned_long,_Molecule> *)local_50,
               (pair<const_unsigned_long,_Molecule> *)(plVar3 + 1));
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_250);
    poVar2 = std::operator<<(poVar2,"\t");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    Molecule::~Molecule((Molecule *)&i_1);
  }
  std::ofstream::~ofstream(local_250);
  std::ofstream::~ofstream(local_450);
  std::ofstream::~ofstream(local_650);
  return;
}

Assistant:

void getStats() {
    cout << "writing stats" << endl;
    ofstream contextTriplesstats(statsDir+"contextTriples.stats");
    for (auto i : contextTriples) {
        contextTriplesstats << i.first << "\t" << i.second << endl;
    }

    ofstream ProvIdxstats(statsDir+"ProvIdx.stats");
    for (auto i : ProvIdx) {
        ProvIdxstats << i.first << "\t" << i.second.size() << endl;
    }

    ofstream Moleculesstats(statsDir+"Molecules.stats");
    for (auto i : M.molecules) {
        Moleculesstats << i.first << "\t" << i.second.next.size() << endl;
    }
}